

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

int ncnn::reduction_op<std::plus<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,int dim,float coeff,Option *opt)

{
  int *piVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  long lVar8;
  void *pvVar9;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  Allocator *pAVar20;
  size_t sVar21;
  ulong uVar22;
  void *pvVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  
  uVar28 = a->w;
  uVar11 = (ulong)uVar28;
  sVar13 = (size_t)(int)uVar28;
  uVar7 = a->h;
  uVar19 = a->c;
  uVar12 = (ulong)uVar19;
  sVar21 = (size_t)(int)uVar19;
  sVar2 = a->elemsize;
  uVar26 = uVar7 * uVar28;
  if (dim == 0) {
    pAVar20 = opt->blob_allocator;
    if ((((b->dims == 1) && (b->w == 1)) && (b->elemsize == sVar2)) && (b->allocator == pAVar20))
    goto switchD_00119a85_caseD_0;
    piVar1 = b->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (b->allocator == (Allocator *)0x0) {
          if (b->data != (void *)0x0) {
            free(*(void **)((long)b->data + -8));
          }
        }
        else {
          (**(code **)(*(long *)b->allocator + 8))();
        }
      }
    }
    b->data = (void *)0x0;
    b->refcount = (int *)0x0;
    b->elemsize = sVar2;
    b->allocator = pAVar20;
    b->dims = 1;
    b->w = 1;
    b->h = 1;
    b->c = 1;
    b->cstep = 1;
    uVar11 = sVar2 + 3 & 0xfffffffffffffffc;
    if (pAVar20 == (Allocator *)0x0) {
      pvVar9 = malloc(uVar11 + 0x1c);
      pvVar10 = (void *)((long)pvVar9 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar10 - 8) = pvVar9;
      sVar13 = 1;
    }
    else {
      pvVar10 = (void *)(*(code *)**(undefined8 **)pAVar20)(pAVar20);
      sVar13 = b->cstep;
    }
    b->data = pvVar10;
    b->refcount = (int *)((long)pvVar10 + uVar11);
    *(undefined4 *)((long)pvVar10 + uVar11) = 1;
    if ((long)b->c * sVar13 == 0) {
      return -100;
    }
    goto LAB_0011a007;
  }
  switch(dim) {
  case 1:
    pAVar20 = opt->blob_allocator;
    if (((b->dims != 1) || (b->w != uVar19)) ||
       ((b->elemsize != sVar2 || (b->allocator != pAVar20)))) {
      piVar1 = b->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (b->allocator == (Allocator *)0x0) {
            if (b->data != (void *)0x0) {
              free(*(void **)((long)b->data + -8));
            }
          }
          else {
            (**(code **)(*(long *)b->allocator + 8))();
          }
        }
      }
      b->data = (void *)0x0;
      b->refcount = (int *)0x0;
      b->elemsize = sVar2;
      b->allocator = pAVar20;
      b->dims = 1;
      b->w = uVar19;
      b->h = 1;
      b->c = 1;
      b->cstep = sVar21;
      sVar3 = sVar21;
      if (uVar19 != 0) goto LAB_0011a3fe;
    }
    break;
  case 2:
    pAVar20 = opt->blob_allocator;
    uVar38 = uVar7;
    uVar39 = uVar19;
LAB_00119c3c:
    Mat::create(b,uVar38,uVar39,sVar2,pAVar20);
    break;
  case -2:
    pAVar20 = opt->blob_allocator;
    uVar38 = uVar28;
    uVar39 = uVar7;
    goto LAB_00119c3c;
  case -1:
    pAVar20 = opt->blob_allocator;
    if (((b->dims == 1) && (b->w == uVar28)) &&
       ((b->elemsize == sVar2 && (b->allocator == pAVar20)))) break;
    piVar1 = b->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (b->allocator == (Allocator *)0x0) {
          if (b->data != (void *)0x0) {
            free(*(void **)((long)b->data + -8));
          }
        }
        else {
          (**(code **)(*(long *)b->allocator + 8))();
        }
      }
    }
    b->data = (void *)0x0;
    b->refcount = (int *)0x0;
    b->elemsize = sVar2;
    b->allocator = pAVar20;
    b->dims = 1;
    b->w = uVar28;
    b->h = 1;
    b->c = 1;
    b->cstep = sVar13;
    sVar3 = sVar13;
    if (uVar28 == 0) break;
LAB_0011a3fe:
    uVar16 = sVar2 * sVar3 + 3 & 0xfffffffffffffffc;
    if (pAVar20 == (Allocator *)0x0) {
      pvVar10 = malloc(uVar16 + 0x1c);
      pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar9 + -8) = pvVar10;
    }
    else {
      pvVar9 = (void *)(*(code *)**(undefined8 **)pAVar20)(pAVar20,uVar16 + 4);
    }
    b->data = pvVar9;
    b->refcount = (int *)(uVar16 + (long)pvVar9);
    *(int *)(uVar16 + (long)pvVar9) = 1;
    goto LAB_00119c85;
  }
switchD_00119a85_caseD_0:
  pvVar9 = b->data;
  if (pvVar9 == (void *)0x0) {
    return -100;
  }
LAB_00119c85:
  sVar3 = b->cstep;
  if (sVar3 * (long)b->c == 0) {
    return -100;
  }
  if (dim == 0) {
LAB_0011a007:
    if (uVar19 == 0) {
      return -100;
    }
    pAVar20 = opt->workspace_allocator;
    uVar11 = sVar2 * sVar21 + 3 & 0xfffffffffffffffc;
    if (pAVar20 == (Allocator *)0x0) {
      pvVar10 = malloc(uVar11 + 0x1c);
      pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar9 - 8) = pvVar10;
    }
    else {
      pvVar9 = (void *)(*(code *)**(undefined8 **)pAVar20)();
    }
    *(undefined4 *)((long)pvVar9 + uVar11) = 1;
    if ((int)uVar19 < 1) {
LAB_0011a0e2:
      fVar29 = 0.0;
    }
    else {
      pvVar10 = a->data;
      sVar2 = a->cstep;
      sVar13 = a->elemsize;
      uVar16 = 0;
      do {
        fVar29 = 0.0;
        if (0 < (int)uVar26) {
          uVar17 = 0;
          do {
            fVar29 = fVar29 + *(float *)((long)pvVar10 + uVar17 * 4);
            uVar17 = uVar17 + 1;
          } while (uVar26 != uVar17);
        }
        *(float *)((long)pvVar9 + uVar16 * 4) = fVar29;
        uVar16 = uVar16 + 1;
        pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar13);
      } while (uVar16 != uVar12);
      if ((int)uVar19 < 1) goto LAB_0011a0e2;
      fVar29 = 0.0;
      uVar16 = 0;
      do {
        fVar29 = fVar29 + *(float *)((long)pvVar9 + uVar16 * 4);
        uVar16 = uVar16 + 1;
      } while (uVar12 != uVar16);
    }
    *(float *)b->data = fVar29 * v0;
    LOCK();
    piVar1 = (int *)((long)pvVar9 + uVar11);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) {
      return 0;
    }
    if (pAVar20 != (Allocator *)0x0) {
      (**(code **)(*(long *)pAVar20 + 8))(pAVar20,pvVar9);
      return 0;
    }
LAB_0011a472:
    free(*(void **)((long)pvVar9 - 8));
  }
  else {
    switch(dim) {
    case 1:
      if (0 < (int)uVar19) {
        sVar2 = a->cstep;
        sVar13 = a->elemsize;
        pvVar9 = a->data;
        pvVar10 = b->data;
        uVar11 = 0;
        do {
          fVar29 = 0.0;
          if (0 < (int)uVar26) {
            uVar16 = 0;
            do {
              fVar29 = fVar29 + *(float *)((long)pvVar9 + uVar16 * 4);
              uVar16 = uVar16 + 1;
            } while (uVar26 != uVar16);
          }
          *(float *)((long)pvVar10 + uVar11 * 4) = fVar29 * v0;
          uVar11 = uVar11 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar13);
        } while (uVar11 != uVar12);
      }
      break;
    case 2:
      if (0 < (int)uVar19) {
        pvVar9 = a->data;
        sVar2 = a->cstep;
        sVar21 = a->elemsize;
        pvVar10 = b->data;
        sVar4 = b->elemsize;
        uVar19 = uVar28 - 1;
        uVar11 = 0;
        do {
          if (0 < (int)uVar7) {
            pvVar23 = (void *)(sVar2 * sVar21 * uVar11 + (long)pvVar9);
            uVar16 = 0;
            do {
              if ((int)uVar28 < 1) {
                fVar29 = 0.0;
              }
              else {
                fVar29 = *(float *)((long)pvVar23 + uVar16 * 4);
                fVar31 = 0.0;
                fVar33 = 0.0;
                fVar35 = 0.0;
                fVar37 = 0.0;
                iVar14 = 4;
                do {
                  fVar36 = fVar37;
                  fVar34 = fVar35;
                  fVar32 = fVar33;
                  fVar30 = fVar31;
                  fVar31 = fVar29 + fVar30;
                  fVar33 = fVar29 + fVar32;
                  fVar35 = fVar29 + fVar34;
                  fVar37 = fVar29 + fVar36;
                  iVar15 = iVar14 + -4;
                  iVar27 = iVar14 + (uVar28 + 3 & 0xfffffffc);
                  iVar14 = iVar15;
                } while (iVar27 != 8);
                uVar26 = -iVar15;
                uVar38 = -(uint)((int)(uVar19 ^ 0x80000000) < (int)(uVar26 ^ 0x80000000));
                uVar39 = -(uint)((int)(uVar19 ^ 0x80000000) < (int)((uVar26 | 1) ^ 0x80000000));
                uVar40 = -(uint)((int)(uVar19 ^ 0x80000000) < (int)((uVar26 | 2) ^ 0x80000000));
                uVar26 = -(uint)((int)(uVar19 ^ 0x80000000) < (int)((uVar26 | 3) ^ 0x80000000));
                fVar29 = (float)(~uVar26 & (uint)fVar37 | (uint)fVar36 & uVar26) +
                         (float)(~uVar39 & (uint)fVar33 | (uint)fVar32 & uVar39) +
                         (float)(~uVar40 & (uint)fVar35 | (uint)fVar34 & uVar40) +
                         (float)(~uVar38 & (uint)fVar31 | (uint)fVar30 & uVar38);
              }
              *(float *)((long)pvVar10 + uVar16 * 4 + sVar3 * sVar4 * uVar11) = fVar29 * v0;
              pvVar23 = (void *)((long)pvVar23 + sVar13 * 4);
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar7);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar12);
      }
      break;
    case -2:
      uVar28 = (int)sVar3 * b->c;
      if (0 < (int)uVar28) {
        memset(pvVar9,0,(ulong)uVar28 << 2);
      }
      if (0 < (int)uVar19) {
        sVar2 = a->cstep;
        sVar13 = a->elemsize;
        pvVar9 = a->data;
        pvVar10 = b->data;
        uVar11 = 0;
        do {
          if (0 < (int)uVar26) {
            uVar16 = 0;
            do {
              *(float *)((long)pvVar10 + uVar16 * 4) =
                   *(float *)((long)pvVar9 + uVar16 * 4) + *(float *)((long)pvVar10 + uVar16 * 4);
              uVar16 = uVar16 + 1;
            } while (uVar26 != uVar16);
          }
          uVar11 = uVar11 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar13);
        } while (uVar11 != uVar12);
      }
      if (0 < (int)uVar26) {
        pvVar9 = b->data;
        uVar12 = 0;
        do {
          *(float *)((long)pvVar9 + uVar12 * 4) = *(float *)((long)pvVar9 + uVar12 * 4) * v0;
          uVar12 = uVar12 + 1;
        } while (uVar26 != uVar12);
      }
      break;
    case -1:
      uVar16 = sVar2 * sVar13 + 0xf & 0xfffffffffffffff0;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = sVar2;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar16;
      lVar8 = SUB168(auVar6 / auVar5,0);
      if (sVar21 * lVar8 == 0) {
        return -100;
      }
      pAVar20 = opt->workspace_allocator;
      uVar17 = sVar21 * lVar8 * sVar2 + 3 & 0xfffffffffffffffc;
      if (pAVar20 == (Allocator *)0x0) {
        pvVar10 = malloc(uVar17 + 0x1c);
        pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar9 - 8) = pvVar10;
      }
      else {
        pvVar9 = (void *)(*(code *)**(undefined8 **)pAVar20)(pAVar20,uVar17 + 4,uVar16 % sVar2);
      }
      *(undefined4 *)((long)pvVar9 + uVar17) = 1;
      uVar26 = uVar19 * SUB164(auVar6 / auVar5,0);
      if (0 < (int)uVar26) {
        memset(pvVar9,0,(ulong)uVar26 << 2);
      }
      if (0 < (int)uVar19) {
        sVar21 = a->cstep;
        sVar3 = a->elemsize;
        pvVar10 = a->data;
        uVar16 = 0;
        do {
          if (0 < (int)uVar7) {
            lVar18 = lVar8 * sVar2 * uVar16;
            pvVar23 = (void *)(sVar21 * sVar3 * uVar16 + (long)pvVar10);
            uVar22 = 0;
            do {
              if (0 < (int)uVar28) {
                lVar25 = 0;
                uVar24 = uVar11;
                do {
                  *(float *)((long)pvVar9 + lVar25 * 4 + lVar18) =
                       *(float *)((long)pvVar23 + uVar22 * 4) +
                       *(float *)((long)pvVar9 + lVar25 * 4 + lVar18);
                  lVar25 = lVar25 + 1;
                  uVar24 = uVar24 - 1;
                } while (uVar24 != 0);
              }
              pvVar23 = (void *)((long)pvVar23 + sVar13 * 4);
              uVar22 = uVar22 + 1;
            } while (uVar22 != uVar7);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar12);
      }
      uVar7 = b->c * (int)b->cstep;
      if (0 < (int)uVar7) {
        memset(b->data,0,(ulong)uVar7 << 2);
      }
      if (0 < (int)uVar19) {
        pvVar10 = b->data;
        uVar16 = 0;
        do {
          if (0 < (int)uVar28) {
            uVar22 = 0;
            do {
              *(float *)((long)pvVar10 + uVar22 * 4) =
                   *(float *)((long)pvVar9 + uVar22 * 4 + lVar8 * sVar2 * uVar16) +
                   *(float *)((long)pvVar10 + uVar22 * 4);
              uVar22 = uVar22 + 1;
            } while (uVar11 != uVar22);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar12);
      }
      if (0 < (int)uVar28) {
        pvVar10 = b->data;
        uVar12 = 0;
        do {
          *(float *)((long)pvVar10 + uVar12 * 4) = *(float *)((long)pvVar10 + uVar12 * 4) * v0;
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
      LOCK();
      piVar1 = (int *)((long)pvVar9 + uVar17);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 != 0) {
        return 0;
      }
      if (pAVar20 != (Allocator *)0x0) {
        (**(code **)(*(long *)pAVar20 + 8))(pAVar20,pvVar9);
        return 0;
      }
      if (pvVar9 == (void *)0x0) {
        return 0;
      }
      goto LAB_0011a472;
    }
  }
  return 0;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, int dim, float coeff, const Option& opt)
{
    Op op;
    Op2 op2;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    size_t elemsize = a.elemsize;
    int size = w * h;

    if (dim == 0)
    {
        // w h c -> X X X
        b.create(1, elemsize, opt.blob_allocator);
    }
    else if (dim == 1)
    {
        // w h c -> X X c
        b.create(channels, elemsize, opt.blob_allocator);
    }
    else if (dim == 2)
    {
        // w h c -> X h c
        b.create(h, channels, elemsize, opt.blob_allocator);
    }
    else if (dim == -1)
    {
        // w h c -> w X X
        b.create(w, elemsize, opt.blob_allocator);
    }
    else if (dim == -2)
    {
        // w h c -> w h X
        b.create(w, h, elemsize, opt.blob_allocator);
    }
    if (b.empty())
        return -100;

    if (dim == 0)
    {
        Mat sums(channels, elemsize, opt.workspace_allocator);
        if (sums.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            float sum = v0;
            for (int i=0; i<size; i++)
            {
                sum = op(sum, ptr[i]);
            }

            sums[q] = sum;
        }

        float sum = v0;
        for (int i=0; i<channels; i++)
        {
            sum = op2(sum, sums[i]);
        }

        b[0] = sum * coeff;
    }
    else if (dim == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            float sum = v0;
            for (int i=0; i<size; i++)
            {
                sum = op(sum, ptr[i]);
            }

            b[q] = sum * coeff;
        }
    }
    else if (dim == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = b.channel(q);

            for (int i=0; i<h; i++)
            {
                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[i] = sum * coeff;

                ptr += w;
            }
        }
    }
    else if (dim == -1)
    {
        Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
        if (mins.empty())
            return -100;

        mins.fill(v0);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);
            float* mins_ptr = mins.channel(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    mins_ptr[j] = op(mins_ptr[j], ptr[i]);
                }

                ptr += w;
            }
        }

        b.fill(v0);

        for (int q=0; q<channels; q++)
        {
            const float* mins_ptr = mins.channel(q);
            for (int j=0; j<w; j++)
            {
                b[j] = op2(b[j], mins_ptr[j]);
            }
        }

        for (int j=0; j<w; j++)
        {
            b[j] *= coeff;
        }
    }
    else if (dim == -2)
    {
        b.fill(v0);

        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            for (int i=0; i<size; i++)
            {
                b[i] = op(b[i], ptr[i]);
            }
        }

        for (int i=0; i<size; i++)
        {
            b[i] *= coeff;
        }
    }

    return 0;
}